

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pparsefp.h
# Opt level: O2

char * parse_double(char *buf,size_t len,double *result)

{
  byte *pbVar1;
  char cVar2;
  uint64_t uVar3;
  undefined1 auVar4 [12];
  char cVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  char *pcVar18;
  grisu3_cast_double_t cd;
  byte *pbVar19;
  uint uVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  grisu3_diy_fp_t x;
  grisu3_diy_fp_t x_00;
  grisu3_diy_fp_t n;
  grisu3_diy_fp_t gVar24;
  grisu3_diy_fp_t gVar25;
  grisu3_diy_fp_t y;
  byte *local_38;
  
  *result = 0.0;
  lVar21 = len + 1;
  if (1000 < len) {
    lVar21 = 0x3e9;
  }
  cVar2 = *buf;
  pcVar18 = buf;
  cVar5 = cVar2;
  if (cVar2 == '-') {
    if (lVar21 == 1) {
      return (char *)0x0;
    }
    pcVar18 = buf + 1;
    cVar5 = buf[1];
  }
  pbVar1 = (byte *)(buf + lVar21);
  if (cVar5 == '0') {
    pbVar9 = (byte *)(pcVar18 + 1);
    if ((pbVar9 != pbVar1) && ((*pbVar9 & 0xdf) == 0x58)) {
      return buf;
    }
    uVar17 = 0;
    for (; (pbVar19 = pbVar1, pbVar10 = pbVar1, pbVar9 != pbVar1 &&
           (pbVar19 = pbVar9, pbVar10 = pbVar9, *pbVar9 == 0x30)); pbVar9 = pbVar9 + 1) {
    }
  }
  else {
    if ((byte)(cVar5 - 0x3aU) < 0xf7) {
      if (cVar2 == '-') {
        return (char *)0x0;
      }
      return buf;
    }
    uVar17 = (ulong)(byte)(cVar5 - 0x30);
    pbVar19 = (byte *)(pcVar18 + 1);
    pbVar10 = (byte *)(pcVar18 + 1);
  }
  for (; iVar13 = 0, pbVar9 = pbVar1, pbVar19 != pbVar1; pbVar19 = pbVar19 + 1) {
    bVar6 = *pbVar19 - 0x30;
    pbVar9 = pbVar19;
    if (9 < bVar6) break;
    if (0x1999999999999998 < uVar17) {
      iVar13 = 1;
      uVar17 = (uVar17 + 1) - (ulong)(*pbVar19 < 0x35);
      break;
    }
    uVar17 = (ulong)bVar6 + uVar17 * 10;
  }
  uVar12 = (ulong)(uint)(((int)lVar21 + (int)buf) - (int)pbVar9);
  iVar14 = (int)pbVar9 - (int)pbVar10;
  for (uVar11 = 0; pbVar19 = pbVar9 + uVar11, pbVar19 != pbVar1; uVar11 = uVar11 + 1) {
    if (*pbVar19 != 0x30) {
      if ((byte)(*pbVar19 - 0x31) < 9) goto LAB_001179b9;
      uVar12 = uVar11 & 0xffffffff;
      break;
    }
  }
  goto LAB_001179df;
  while ((byte)(*pbVar19 - 0x30) < 10) {
LAB_00117a6b:
    pbVar19 = pbVar19 + 1;
    if (pbVar19 == pbVar1) break;
  }
  goto LAB_00117a87;
  while (uVar11 = uVar12, (byte)(*pbVar19 - 0x30) < 10) {
LAB_001179b9:
    uVar12 = uVar11 + 1;
    pbVar19 = pbVar9 + uVar12;
    if (pbVar19 == pbVar1) break;
  }
  iVar13 = 1;
LAB_001179df:
  iVar8 = (int)uVar12;
  if ((pbVar19 != pbVar1) && (*pbVar19 == 0x2e)) {
    if ((byte)(pbVar19[1] - 0x3a) < 0xf6) {
      return (char *)0x0;
    }
    while (pbVar19 = pbVar19 + 1, pbVar19 != pbVar1) {
      bVar6 = *pbVar19 - 0x30;
      if (9 < bVar6) break;
      if (0x1999999999999998 < uVar17) {
        bVar22 = iVar13 == 0;
        iVar13 = 1;
        if (bVar22) {
          uVar17 = (uVar17 + 1) - (ulong)(*pbVar19 < 0x35);
        }
        break;
      }
      uVar17 = (ulong)bVar6 + uVar17 * 10;
      uVar12 = (ulong)((int)uVar12 - 1);
      iVar14 = iVar14 + 1;
    }
    do {
      iVar8 = (int)uVar12;
      if (pbVar19 == pbVar1) break;
      if (*pbVar19 != 0x30) {
        if ((byte)(*pbVar19 - 0x31) < 9) {
          iVar13 = 1;
          goto LAB_00117a6b;
        }
        break;
      }
      uVar12 = (ulong)(iVar8 + 1);
      pbVar19 = pbVar19 + 1;
    } while( true );
  }
LAB_00117a87:
  bVar22 = true;
  uVar7 = 0;
  if ((pbVar19 != pbVar1) && (uVar7 = 0, (*pbVar19 & 0xdf) == 0x45)) {
    if ((long)pbVar1 - (long)pbVar19 < 2) {
      return (char *)0x0;
    }
    if (pbVar19[1] == 0x2d) {
      bVar22 = false;
LAB_00117acf:
      pbVar19 = pbVar19 + 2;
      if (pbVar19 == pbVar1) {
        return (char *)0x0;
      }
    }
    else {
      bVar22 = true;
      if (pbVar19[1] == 0x2b) goto LAB_00117acf;
      pbVar19 = pbVar19 + 1;
    }
    if ((byte)(*pbVar19 - 0x3a) < 0xf6) {
      return (char *)0x0;
    }
    uVar7 = (uint)(byte)(*pbVar19 - 0x30);
    while ((pbVar19 = pbVar19 + 1, pbVar19 != pbVar1 && ((byte)(*pbVar19 - 0x30) < 10))) {
      if ((int)uVar7 < 0x8000) {
        uVar7 = uVar7 * 10 + -0x30 + (uint)*pbVar19;
      }
    }
  }
  if (pbVar19 == pbVar1) {
    return (char *)0x0;
  }
  uVar20 = -uVar7;
  if (bVar22) {
    uVar20 = uVar7;
  }
  dVar23 = 0.0;
  if ((uVar17 != 0) && (uVar20 = iVar8 + iVar14 + uVar20, -0x145 < (int)uVar20)) {
    if ((int)uVar20 < 0x137) {
      if ((uVar17 >> 0x35 != 0) || (0x16 < uVar20)) {
        uVar20 = uVar20 - iVar14;
        gVar24._8_8_ = 0;
        gVar24.f = uVar17;
        gVar24 = grisu3_diy_fp_normalize(gVar24);
        auVar4 = gVar24._0_12_;
        iVar13 = (iVar13 << 2) << (-(char)gVar24.e & 0x1fU);
        if ((int)uVar20 < -0x15c) {
          pcVar18 = "-348 <= d_exp";
          uVar7 = 0x4f;
LAB_0011806e:
          __assert_fail(pcVar18,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                        ,uVar7,"int grisu3_diy_fp_cached_dec_pow(int, grisu3_diy_fp_t *)");
        }
        if (0x15b < (int)uVar20) {
          pcVar18 = "d_exp < 340 + d_exp_dist";
          uVar7 = 0x50;
          goto LAB_0011806e;
        }
        uVar7 = uVar20 + 0x15c >> 3;
        uVar15 = (uint)grisu3_diy_fp_pow_cache[uVar7].d_exp;
        if ((int)uVar20 < (int)uVar15) {
          pcVar18 = "a_exp <= d_exp";
          uVar7 = 0x57;
          goto LAB_0011806e;
        }
        if ((int)(uVar15 + 8) <= (int)uVar20) {
          pcVar18 = "d_exp < a_exp + d_exp_dist";
          uVar7 = 0x58;
          goto LAB_0011806e;
        }
        uVar3 = grisu3_diy_fp_pow_cache[uVar7].fract;
        gVar25.e = (int)grisu3_diy_fp_pow_cache[uVar7].b_exp;
        iVar8 = iVar13;
        if (uVar20 != uVar15) {
          uVar20 = uVar20 + ~uVar15;
          if (6 < uVar20) {
            __assert_fail("adj_exp >= 0 && adj_exp < 7",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                          ,0xb8,"int grisu3_diy_fp_encode_double(uint64_t, int, int, int, double *)"
                         );
          }
          x._12_4_ = 0;
          x.f = auVar4._0_8_;
          x.e = auVar4._8_4_;
          y._12_4_ = 0;
          y._0_12_ = *(undefined1 (*) [12])
                      (grisu3_diy_fp_encode_double_cp_10_lut + (ulong)uVar20 * 0x10);
          gVar24 = grisu3_diy_fp_multiply(x,y);
          auVar4 = gVar24._0_12_;
          iVar8 = iVar13 + 4;
          if ((int)(uVar20 + iVar14 + 1) < 0x14) {
            iVar8 = iVar13;
          }
        }
        x_00._12_4_ = 0;
        x_00.f = auVar4._0_8_;
        x_00.e = auVar4._8_4_;
        gVar25.f = uVar3;
        gVar25._12_4_ = 0;
        gVar24 = grisu3_diy_fp_multiply(x_00,gVar25);
        n._12_4_ = 0;
        n.f = SUB128(gVar24._0_12_,0);
        n.e = SUB124(gVar24._0_12_,8);
        gVar25 = grisu3_diy_fp_normalize(n);
        auVar4 = gVar25._0_12_;
        iVar13 = gVar25.e;
        iVar14 = 0x40;
        if (-0x472 < iVar13) {
          iVar14 = -(iVar13 + 0x432);
        }
        iVar16 = 0;
        if (iVar13 < -0x432) {
          iVar16 = iVar14;
        }
        iVar14 = (9 - (uint)(iVar8 == 0)) + iVar8 << ((char)gVar24.e - (char)gVar25.e & 0x1fU);
        if (0x3c < iVar16) {
          bVar6 = (char)iVar16 - 0x3e;
          auVar4._8_4_ = iVar13 + iVar16 + -0x3e;
          auVar4._0_8_ = gVar25.f >> (bVar6 & 0x3f);
          iVar14 = (iVar14 >> (bVar6 & 0x1f)) + 9;
          iVar16 = 0x3e;
        }
        uVar17 = auVar4._0_8_ >> ((byte)iVar16 & 0x3f);
        iVar8 = auVar4._8_4_ + iVar16;
        uVar7 = (uint)(1L << ((byte)iVar16 - 1 & 0x3f));
        iVar13 = iVar14 + uVar7 * 8;
        if ((iVar13 <= iVar16) && (uVar17 = uVar17 + 1, (uVar17 & 0x20000000000000) != 0)) {
          uVar17 = uVar17 >> 1;
          iVar8 = iVar8 + 1;
        }
        for (; 0x1fffffffffffff < uVar17; uVar17 = uVar17 >> 1) {
          iVar8 = iVar8 + 1;
        }
        dVar23 = 0.0;
        if (-0x433 < iVar8) {
          uVar20 = iVar8 + 0x433;
          while( true ) {
            uVar11 = uVar17 & 0x10000000000000;
            if (((int)(uVar20 - 0x433) < -0x431) || (uVar11 != 0)) break;
            uVar17 = uVar17 * 2;
            uVar20 = uVar20 - 1;
          }
          if (uVar11 != 0) {
            uVar11 = (ulong)uVar20 << 0x34;
          }
          if (uVar20 != 1) {
            uVar11 = (ulong)uVar20 << 0x34;
          }
          dVar23 = (double)(uVar17 & 0xfffffffffffff | uVar11);
        }
        iVar8 = (uVar7 & auVar4._0_4_) * 8;
        *result = dVar23;
        if (((int)(uVar7 * 8 - iVar14) < iVar8) && (iVar8 < iVar13)) {
          dVar23 = strtod(buf,(char **)&local_38);
          *result = dVar23;
          if (local_38 < pbVar19) {
            return (char *)local_38;
          }
          return (char *)pbVar19;
        }
        goto LAB_00117b5a;
      }
      dVar23 = (double)(long)uVar17;
      switch(uVar20 - iVar14) {
      case 1:
        dVar23 = dVar23 * 10.0;
        break;
      case 2:
        dVar23 = dVar23 * 100.0;
        break;
      case 3:
        dVar23 = dVar23 * 1000.0;
        break;
      case 4:
        dVar23 = dVar23 * 10000.0;
        break;
      case 5:
        dVar23 = dVar23 * 100000.0;
        break;
      case 6:
        dVar23 = dVar23 * 1000000.0;
        break;
      case 7:
        dVar23 = dVar23 * 10000000.0;
        break;
      case 8:
        dVar23 = dVar23 * 100000000.0;
        break;
      case 9:
        dVar23 = dVar23 * 1000000000.0;
        break;
      case 10:
        dVar23 = dVar23 * 10000000000.0;
        break;
      case 0xb:
        dVar23 = dVar23 * 100000000000.0;
        break;
      case 0xc:
        dVar23 = dVar23 * 1000000000000.0;
        break;
      case 0xd:
        dVar23 = dVar23 * 10000000000000.0;
        break;
      case 0xe:
        dVar23 = dVar23 * 100000000000000.0;
        break;
      case 0xf:
        dVar23 = dVar23 * 1e+15;
        break;
      case 0x10:
        dVar23 = dVar23 * 1e+16;
        break;
      case 0x11:
        dVar23 = dVar23 * 1e+17;
        break;
      case 0x12:
        dVar23 = dVar23 * 1e+18;
        break;
      case 0x13:
        dVar23 = dVar23 * 1e+19;
        break;
      case 0x14:
        dVar23 = dVar23 * 1e+20;
        break;
      case 0x15:
        dVar23 = dVar23 * 1e+21;
        break;
      case 0x16:
        dVar23 = dVar23 * 1e+22;
        break;
      case 0xffffffea:
        dVar23 = dVar23 / 1e+22;
        break;
      case 0xffffffeb:
        dVar23 = dVar23 / 1e+21;
        break;
      case 0xffffffec:
        dVar23 = dVar23 / 1e+20;
        break;
      case 0xffffffed:
        dVar23 = dVar23 / 1e+19;
        break;
      case 0xffffffee:
        dVar23 = dVar23 / 1e+18;
        break;
      case 0xffffffef:
        dVar23 = dVar23 / 1e+17;
        break;
      case 0xfffffff0:
        dVar23 = dVar23 / 1e+16;
        break;
      case 0xfffffff1:
        dVar23 = dVar23 / 1e+15;
        break;
      case 0xfffffff2:
        dVar23 = dVar23 / 100000000000000.0;
        break;
      case 0xfffffff3:
        dVar23 = dVar23 / 10000000000000.0;
        break;
      case 0xfffffff4:
        dVar23 = dVar23 / 1000000000000.0;
        break;
      case 0xfffffff5:
        dVar23 = dVar23 / 100000000000.0;
        break;
      case 0xfffffff6:
        dVar23 = dVar23 / 10000000000.0;
        break;
      case 0xfffffff7:
        dVar23 = dVar23 / 1000000000.0;
        break;
      case 0xfffffff8:
        dVar23 = dVar23 / 100000000.0;
        break;
      case 0xfffffff9:
        dVar23 = dVar23 / 10000000.0;
        break;
      case 0xfffffffa:
        dVar23 = dVar23 / 1000000.0;
        break;
      case 0xfffffffb:
        dVar23 = dVar23 / 100000.0;
        break;
      case 0xfffffffc:
        dVar23 = dVar23 / 10000.0;
        break;
      case 0xfffffffd:
        dVar23 = dVar23 / 1000.0;
        break;
      case 0xfffffffe:
        dVar23 = dVar23 / 100.0;
        break;
      case 0xffffffff:
        dVar23 = dVar23 / 10.0;
      }
    }
    else {
      dVar23 = INFINITY;
    }
  }
  *result = dVar23;
LAB_00117b5a:
  if (cVar2 == '-') {
    *result = (double)((ulong)dVar23 ^ (ulong)DAT_00122160);
    return (char *)pbVar19;
  }
  return (char *)pbVar19;
}

Assistant:

static inline const char *parse_double(const char *buf, size_t len, double *result)
{
    return grisu3_parse_double(buf, len, result);
}